

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t __size;
  undefined1 auVar9 [16];
  size_t sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  unsigned_short *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int *__s;
  int *piVar17;
  int *__s_00;
  uint *puVar18;
  uint *puVar19;
  uint *puVar20;
  uint *puVar21;
  uint *puVar22;
  unsigned_short uVar23;
  ulong uVar24;
  undefined1 auVar25 [8];
  ulong uVar26;
  uchar uVar27;
  size_t sVar28;
  ulong uVar29;
  uint *puVar30;
  uint *puVar31;
  LodePNGCompressSettings *pLVar32;
  ulong insize_00;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint *puVar36;
  ulong uVar37;
  int iVar38;
  ulong inpos;
  long lVar39;
  uchar *puVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar77;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar86;
  int iVar87;
  ucvector local_228;
  uint *local_210;
  uint *local_208;
  size_t local_200;
  undefined1 local_1f8 [16];
  size_t local_1e8;
  size_t local_1e0;
  ulong local_1d8;
  uchar *local_1d0;
  uint *local_1c8;
  LodePNGCompressSettings *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong *local_1a0;
  undefined1 local_198 [8];
  int iStack_190;
  int iStack_18c;
  HuffmanTree tree_ll;
  undefined1 local_158 [16];
  size_t local_148;
  HuffmanTree tree_d;
  HuffmanTree tree_cl;
  undefined1 local_d8 [16];
  size_t local_c8;
  ulong local_b8;
  uint *local_b0;
  unsigned_short *local_a8;
  int *local_a0;
  unsigned_short *local_98;
  unsigned_short *local_90;
  undefined1 local_88 [16];
  size_t local_78;
  ulong local_70;
  int *local_68;
  Hash local_60;
  
  local_228.data = *out;
  local_228.size = *outsize;
  local_1e0 = 0;
  uVar14 = settings->btype;
  uVar15 = 0x3d;
  if (uVar14 < 3) {
    local_1b0 = insize;
    local_228.allocsize = local_228.size;
    local_200 = insize;
    local_1a0 = outsize;
    if (uVar14 != 1) {
      if (uVar14 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar15 = 0;
        }
        else {
          puVar36 = (uint *)((insize + 0xfffe) / 0xffff);
          uVar34 = (long)puVar36 - 1;
          local_1a8 = 0;
          auVar9._12_4_ = 0;
          auVar9._0_12_ = stack0xfffffffffffffe6c;
          _local_198 = auVar9 << 0x20;
          local_210 = puVar36;
          do {
            puVar22 = (uint *)local_228.allocsize;
            sVar28 = local_228.size;
            puVar20 = (uint *)local_228.data;
            puVar19 = (uint *)(local_228.size + 1);
            puVar18 = (uint *)local_228.data;
            puVar21 = (uint *)local_228.allocsize;
            if (local_228.allocsize < puVar19) {
              puVar21 = (uint *)((ulong)((long)puVar19 * 3) >> 1);
              if ((uint *)(local_228.allocsize * 2) < puVar19) {
                puVar21 = puVar19;
              }
              puVar18 = (uint *)realloc(local_228.data,(size_t)puVar21);
              insize = local_200;
              puVar30 = puVar19;
              if (puVar18 != (uint *)0x0) goto LAB_0010d059;
            }
            else {
LAB_0010d059:
              local_228.allocsize = (size_t)puVar21;
              local_228.data = (uchar *)puVar18;
              *(bool *)((long)local_228.data + sVar28) = local_1a8 == uVar34;
              puVar30 = (uint *)(sVar28 + 2);
              puVar20 = (uint *)local_228.data;
              puVar22 = (uint *)local_228.allocsize;
              local_228.size = (size_t)puVar19;
            }
            local_1d8 = (ulong)(uint)local_198._0_4_;
            iVar72 = (int)insize - local_198._0_4_;
            if (0xfffe < insize - local_1d8) {
              iVar72 = 0xffff;
            }
            puVar19 = puVar20;
            puVar18 = (uint *)local_228.data;
            puVar21 = (uint *)local_228.allocsize;
            if (puVar22 < puVar30) {
              puVar21 = (uint *)((ulong)((long)puVar30 * 3) >> 1);
              if ((uint *)((long)puVar22 * 2) < puVar30) {
                puVar21 = puVar30;
              }
              puVar19 = (uint *)realloc(puVar20,(size_t)puVar21);
              insize = local_200;
              puVar31 = puVar30;
              puVar18 = puVar19;
              if (puVar19 != (uint *)0x0) goto LAB_0010d0f7;
            }
            else {
LAB_0010d0f7:
              local_228.allocsize = (size_t)puVar21;
              local_228.data = (uchar *)puVar18;
              *(char *)((long)puVar19 + -1 + (long)puVar30) = (char)iVar72;
              puVar31 = (uint *)((long)puVar30 + 1);
              puVar20 = (uint *)local_228.data;
              puVar22 = (uint *)local_228.allocsize;
              local_228.size = (size_t)puVar30;
            }
            puVar19 = puVar20;
            puVar18 = (uint *)local_228.data;
            puVar21 = (uint *)local_228.allocsize;
            if (puVar22 < puVar31) {
              puVar21 = (uint *)((ulong)((long)puVar31 * 3) >> 1);
              if ((uint *)((long)puVar22 * 2) < puVar31) {
                puVar21 = puVar31;
              }
              puVar19 = (uint *)realloc(puVar20,(size_t)puVar21);
              insize = local_200;
              puVar30 = puVar31;
              puVar18 = puVar19;
              if (puVar19 != (uint *)0x0) goto LAB_0010d15c;
            }
            else {
LAB_0010d15c:
              local_228.allocsize = (size_t)puVar21;
              local_228.data = (uchar *)puVar18;
              *(char *)((long)puVar19 + -1 + (long)puVar31) = (char)((uint)iVar72 >> 8);
              puVar30 = (uint *)((long)puVar31 + 1);
              puVar20 = (uint *)local_228.data;
              puVar22 = (uint *)local_228.allocsize;
              local_228.size = (size_t)puVar31;
            }
            puVar19 = puVar20;
            puVar18 = (uint *)local_228.data;
            puVar21 = (uint *)local_228.allocsize;
            if (puVar22 < puVar30) {
              puVar21 = (uint *)((ulong)((long)puVar30 * 3) >> 1);
              if ((uint *)((long)puVar22 * 2) < puVar30) {
                puVar21 = puVar30;
              }
              puVar19 = (uint *)realloc(puVar20,(size_t)puVar21);
              insize = local_200;
              puVar31 = puVar30;
              puVar18 = puVar19;
              if (puVar19 != (uint *)0x0) goto LAB_0010d1c8;
            }
            else {
LAB_0010d1c8:
              local_228.allocsize = (size_t)puVar21;
              local_228.data = (uchar *)puVar18;
              *(char *)((long)puVar19 + -1 + (long)puVar30) = (char)(0xffff - iVar72);
              puVar31 = (uint *)((long)puVar30 + 1);
              puVar20 = (uint *)local_228.data;
              puVar22 = (uint *)local_228.allocsize;
              local_228.size = (size_t)puVar30;
            }
            puVar21 = (uint *)local_228.data;
            puVar19 = (uint *)local_228.allocsize;
            if (puVar22 < puVar31) {
              puVar19 = (uint *)((ulong)((long)puVar31 * 3) >> 1);
              if ((uint *)((long)puVar22 * 2) < puVar31) {
                puVar19 = puVar31;
              }
              puVar20 = (uint *)realloc(puVar20,(size_t)puVar19);
              insize = local_200;
              puVar21 = puVar20;
              if (puVar20 != (uint *)0x0) goto LAB_0010d224;
            }
            else {
LAB_0010d224:
              local_228.allocsize = (size_t)puVar19;
              local_228.data = (uchar *)puVar21;
              *(char *)((long)puVar20 + -1 + (long)puVar31) = (char)((uint)(0xffff - iVar72) >> 8);
              local_228.size = (size_t)puVar31;
            }
            if (local_1d8 < insize) {
              uVar33 = local_1d8;
              puVar19 = (uint *)local_228.allocsize;
              uVar24 = local_1d8;
              puVar20 = (uint *)local_228.data;
              puVar22 = (uint *)local_228.size;
              uVar35 = 0;
              do {
                uVar27 = in[uVar33];
                puVar36 = (uint *)((long)puVar22 + 1);
                puVar21 = puVar20;
                puVar18 = puVar19;
                if (puVar19 < puVar36) {
                  puVar18 = (uint *)((ulong)((long)puVar36 * 3) >> 1);
                  if ((uint *)((long)puVar19 * 2) < puVar36) {
                    puVar18 = puVar36;
                  }
                  local_198[0] = uVar27;
                  puVar21 = (uint *)realloc(puVar20,(size_t)puVar18);
                  insize = local_200;
                  uVar24 = local_1d8;
                  uVar27 = local_198[0];
                  if (puVar21 != (uint *)0x0) goto LAB_0010d2a7;
                }
                else {
LAB_0010d2a7:
                  puVar19 = puVar18;
                  *(uchar *)((long)puVar21 + -1 + (long)puVar36) = uVar27;
                  puVar20 = puVar21;
                  puVar22 = puVar36;
                }
                uVar26 = uVar35 + 1;
              } while ((uVar35 < 0xfffe) &&
                      (uVar33 = (ulong)((int)uVar24 + (int)uVar35 + 1), uVar35 = uVar26,
                      uVar33 < insize));
              local_198._0_4_ = (int)uVar24 + (int)uVar26;
              puVar36 = local_210;
              local_228.data = (uchar *)puVar20;
              local_228.size = (size_t)puVar22;
              local_228.allocsize = (size_t)puVar19;
            }
            local_1a8 = local_1a8 + 1;
          } while ((uint *)local_1a8 != puVar36);
          uVar15 = 0;
          outsize = local_1a0;
        }
        goto LAB_0010e273;
      }
      uVar34 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar34 = insize >> 3;
      }
      if (0x3fff7 < uVar34) {
        uVar34 = 0x3fff8;
      }
      local_1b0 = uVar34 + 8;
    }
    local_1b8 = 1;
    if (!CARRY8(insize - 1,local_1b0)) {
      local_1b8 = ((insize - 1) + local_1b0) / local_1b0;
    }
    uVar34 = (ulong)settings->windowsize;
    local_1c0 = settings;
    __s = (int *)malloc(0x40000);
    local_60.head = __s;
    piVar17 = (int *)malloc(uVar34 * 4);
    __size = uVar34 * 2;
    local_60.val = piVar17;
    local_90 = (unsigned_short *)malloc(__size);
    local_60.chain = local_90;
    local_98 = (unsigned_short *)malloc(__size);
    local_60.zeros = local_98;
    __s_00 = (int *)malloc(0x40c);
    local_60.headz = __s_00;
    local_a8 = (unsigned_short *)malloc(__size);
    puVar13 = local_90;
    uVar15 = 0x53;
    outsize = local_1a0;
    if (((((piVar17 != (int *)0x0) && (__s != (int *)0x0)) && (local_90 != (unsigned_short *)0x0))
        && ((local_98 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_a8 != (unsigned_short *)0x0)) {
      local_a0 = piVar17;
      local_60.chainz = local_a8;
      memset(__s,0xff,0x40000);
      local_68 = __s;
      if (uVar34 == 0) {
        memset(__s_00,0xff,0x40c);
        uVar33 = local_1b0;
      }
      else {
        memset(local_a0,0xff,uVar34 * 4);
        uVar33 = local_1b0;
        auVar9 = _DAT_00121060;
        lVar39 = uVar34 - 1;
        auVar45._8_4_ = (int)lVar39;
        auVar45._0_8_ = lVar39;
        auVar45._12_4_ = (int)((ulong)lVar39 >> 0x20);
        uVar24 = 0;
        _local_198 = auVar45 ^ _DAT_00121060;
        auVar54 = _DAT_00122730;
        auVar80 = _DAT_00122740;
        auVar84 = _DAT_00122750;
        auVar58 = _DAT_00122700;
        do {
          auVar45 = auVar58 ^ auVar9;
          iVar38 = local_198._0_4_;
          iVar72 = -(uint)(iVar38 < auVar45._0_4_);
          iVar85 = local_198._4_4_;
          auVar46._4_4_ = -(uint)(iVar85 < auVar45._4_4_);
          iVar86 = local_198._8_4_;
          iVar77 = -(uint)(iVar86 < auVar45._8_4_);
          iVar87 = local_198._12_4_;
          auVar46._12_4_ = -(uint)(iVar87 < auVar45._12_4_);
          auVar64._4_4_ = iVar72;
          auVar64._0_4_ = iVar72;
          auVar64._8_4_ = iVar77;
          auVar64._12_4_ = iVar77;
          auVar78 = pshuflw(in_XMM8,auVar64,0xe8);
          auVar48._4_4_ = -(uint)(auVar45._4_4_ == iVar85);
          auVar48._12_4_ = -(uint)(auVar45._12_4_ == iVar87);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar83 = pshuflw(in_XMM9,auVar48,0xe8);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar45 = pshuflw(auVar78,auVar46,0xe8);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          auVar79 = (auVar45 | auVar83 & auVar78) ^ auVar79;
          auVar45 = packssdw(auVar79,auVar79);
          uVar23 = (unsigned_short)uVar24;
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar13[uVar24] = uVar23;
          }
          auVar46 = auVar48 & auVar64 | auVar46;
          auVar45 = packssdw(auVar46,auVar46);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar2,auVar45 ^ auVar2);
          if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
            puVar13[uVar24 + 1] = uVar23 + 1;
          }
          auVar45 = auVar84 ^ auVar9;
          iVar72 = -(uint)(iVar38 < auVar45._0_4_);
          auVar73._4_4_ = -(uint)(iVar85 < auVar45._4_4_);
          iVar77 = -(uint)(iVar86 < auVar45._8_4_);
          auVar73._12_4_ = -(uint)(iVar87 < auVar45._12_4_);
          auVar47._4_4_ = iVar72;
          auVar47._0_4_ = iVar72;
          auVar47._8_4_ = iVar77;
          auVar47._12_4_ = iVar77;
          auVar65._4_4_ = -(uint)(auVar45._4_4_ == iVar85);
          auVar65._12_4_ = -(uint)(auVar45._12_4_ == iVar87);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar45 = auVar65 & auVar47 | auVar73;
          auVar45 = packssdw(auVar45,auVar45);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar3,auVar45 ^ auVar3);
          if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 2] = uVar23 + 2;
          }
          auVar79 = pshufhw(auVar47,auVar47,0x84);
          auVar46 = pshufhw(auVar65,auVar65,0x84);
          auVar48 = pshufhw(auVar79,auVar73,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar48 | auVar46 & auVar79) ^ auVar49;
          auVar79 = packssdw(auVar49,auVar49);
          if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 3] = uVar23 + 3;
          }
          auVar79 = auVar80 ^ auVar9;
          iVar72 = -(uint)(iVar38 < auVar79._0_4_);
          auVar51._4_4_ = -(uint)(iVar85 < auVar79._4_4_);
          iVar77 = -(uint)(iVar86 < auVar79._8_4_);
          auVar51._12_4_ = -(uint)(iVar87 < auVar79._12_4_);
          auVar66._4_4_ = iVar72;
          auVar66._0_4_ = iVar72;
          auVar66._8_4_ = iVar77;
          auVar66._12_4_ = iVar77;
          auVar45 = pshuflw(auVar45,auVar66,0xe8);
          auVar50._4_4_ = -(uint)(auVar79._4_4_ == iVar85);
          auVar50._12_4_ = -(uint)(auVar79._12_4_ == iVar87);
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          in_XMM9 = pshuflw(auVar83 & auVar78,auVar50,0xe8);
          in_XMM9 = in_XMM9 & auVar45;
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar45 = pshuflw(auVar45,auVar51,0xe8);
          auVar78._8_4_ = 0xffffffff;
          auVar78._0_8_ = 0xffffffffffffffff;
          auVar78._12_4_ = 0xffffffff;
          auVar78 = (auVar45 | in_XMM9) ^ auVar78;
          auVar45 = packssdw(auVar78,auVar78);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 4] = uVar23 + 4;
          }
          auVar51 = auVar50 & auVar66 | auVar51;
          auVar45 = packssdw(auVar51,auVar51);
          auVar83._8_4_ = 0xffffffff;
          auVar83._0_8_ = 0xffffffffffffffff;
          auVar83._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar83,auVar45 ^ auVar83);
          if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 5] = uVar23 + 5;
          }
          auVar45 = auVar54 ^ auVar9;
          iVar72 = -(uint)(iVar38 < auVar45._0_4_);
          auVar74._4_4_ = -(uint)(iVar85 < auVar45._4_4_);
          iVar77 = -(uint)(iVar86 < auVar45._8_4_);
          auVar74._12_4_ = -(uint)(iVar87 < auVar45._12_4_);
          auVar52._4_4_ = iVar72;
          auVar52._0_4_ = iVar72;
          auVar52._8_4_ = iVar77;
          auVar52._12_4_ = iVar77;
          auVar67._4_4_ = -(uint)(auVar45._4_4_ == iVar85);
          auVar67._12_4_ = -(uint)(auVar45._12_4_ == iVar87);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar45 = auVar67 & auVar52 | auVar74;
          auVar45 = packssdw(auVar45,auVar45);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar45 ^ auVar4,auVar45 ^ auVar4);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 6] = uVar23 + 6;
          }
          auVar45 = pshufhw(auVar52,auVar52,0x84);
          auVar48 = pshufhw(auVar67,auVar67,0x84);
          auVar79 = pshufhw(auVar45,auVar74,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar79 | auVar48 & auVar45) ^ auVar53;
          auVar45 = packssdw(auVar53,auVar53);
          if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar13[uVar24 + 7] = uVar23 + 7;
          }
          uVar24 = uVar24 + 8;
          lVar39 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + 8;
          auVar58._8_8_ = lVar39 + 8;
          lVar39 = auVar84._8_8_;
          auVar84._0_8_ = auVar84._0_8_ + 8;
          auVar84._8_8_ = lVar39 + 8;
          lVar39 = auVar80._8_8_;
          auVar80._0_8_ = auVar80._0_8_ + 8;
          auVar80._8_8_ = lVar39 + 8;
          lVar39 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 8;
          auVar54._8_8_ = lVar39 + 8;
        } while ((uVar34 + 7 & 0xfffffffffffffff8) != uVar24);
        memset(__s_00,0xff,0x40c);
        auVar9 = _DAT_00121060;
        uVar24 = 0;
        auVar41 = _DAT_00122730;
        auVar42 = _DAT_00122740;
        auVar43 = _DAT_00122750;
        auVar44 = _DAT_00122700;
        do {
          auVar54 = auVar44 ^ auVar9;
          iVar72 = -(uint)((int)local_198._0_4_ < auVar54._0_4_);
          auVar56._4_4_ = -(uint)((int)local_198._4_4_ < auVar54._4_4_);
          iVar77 = -(uint)(iStack_190 < auVar54._8_4_);
          auVar56._12_4_ = -(uint)(iStack_18c < auVar54._12_4_);
          auVar68._4_4_ = iVar72;
          auVar68._0_4_ = iVar72;
          auVar68._8_4_ = iVar77;
          auVar68._12_4_ = iVar77;
          auVar80 = pshuflw(in_XMM8,auVar68,0xe8);
          auVar55._4_4_ = -(uint)(auVar54._4_4_ == local_198._4_4_);
          auVar55._12_4_ = -(uint)(auVar54._12_4_ == iStack_18c);
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar84 = pshuflw(in_XMM9,auVar55,0xe8);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar54 = pshuflw(auVar80,auVar56,0xe8);
          auVar81._8_4_ = 0xffffffff;
          auVar81._0_8_ = 0xffffffffffffffff;
          auVar81._12_4_ = 0xffffffff;
          auVar81 = (auVar54 | auVar84 & auVar80) ^ auVar81;
          auVar54 = packssdw(auVar81,auVar81);
          uVar23 = (unsigned_short)uVar24;
          if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_a8[uVar24] = uVar23;
          }
          auVar56 = auVar55 & auVar68 | auVar56;
          auVar54 = packssdw(auVar56,auVar56);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar5,auVar54 ^ auVar5);
          if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
            local_a8[uVar24 + 1] = uVar23 + 1;
          }
          auVar54 = auVar43 ^ auVar9;
          iVar72 = -(uint)((int)local_198._0_4_ < auVar54._0_4_);
          auVar75._4_4_ = -(uint)((int)local_198._4_4_ < auVar54._4_4_);
          iVar77 = -(uint)(iStack_190 < auVar54._8_4_);
          auVar75._12_4_ = -(uint)(iStack_18c < auVar54._12_4_);
          auVar57._4_4_ = iVar72;
          auVar57._0_4_ = iVar72;
          auVar57._8_4_ = iVar77;
          auVar57._12_4_ = iVar77;
          auVar69._4_4_ = -(uint)(auVar54._4_4_ == local_198._4_4_);
          auVar69._12_4_ = -(uint)(auVar54._12_4_ == iStack_18c);
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar54 = auVar69 & auVar57 | auVar75;
          auVar54 = packssdw(auVar54,auVar54);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar6,auVar54 ^ auVar6);
          if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 2] = uVar23 + 2;
          }
          auVar58 = pshufhw(auVar57,auVar57,0x84);
          auVar79 = pshufhw(auVar69,auVar69,0x84);
          auVar45 = pshufhw(auVar58,auVar75,0x84);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar45 | auVar79 & auVar58) ^ auVar59;
          auVar58 = packssdw(auVar59,auVar59);
          if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 3] = uVar23 + 3;
          }
          auVar58 = auVar42 ^ auVar9;
          iVar72 = -(uint)((int)local_198._0_4_ < auVar58._0_4_);
          auVar61._4_4_ = -(uint)((int)local_198._4_4_ < auVar58._4_4_);
          iVar77 = -(uint)(iStack_190 < auVar58._8_4_);
          auVar61._12_4_ = -(uint)(iStack_18c < auVar58._12_4_);
          auVar70._4_4_ = iVar72;
          auVar70._0_4_ = iVar72;
          auVar70._8_4_ = iVar77;
          auVar70._12_4_ = iVar77;
          auVar54 = pshuflw(auVar54,auVar70,0xe8);
          auVar60._4_4_ = -(uint)(auVar58._4_4_ == local_198._4_4_);
          auVar60._12_4_ = -(uint)(auVar58._12_4_ == iStack_18c);
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          in_XMM9 = pshuflw(auVar84 & auVar80,auVar60,0xe8);
          in_XMM9 = in_XMM9 & auVar54;
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar54 = pshuflw(auVar54,auVar61,0xe8);
          auVar82._8_4_ = 0xffffffff;
          auVar82._0_8_ = 0xffffffffffffffff;
          auVar82._12_4_ = 0xffffffff;
          auVar82 = (auVar54 | in_XMM9) ^ auVar82;
          auVar54 = packssdw(auVar82,auVar82);
          if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 4] = uVar23 + 4;
          }
          auVar61 = auVar60 & auVar70 | auVar61;
          auVar54 = packssdw(auVar61,auVar61);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar54 = packssdw(auVar54 ^ auVar7,auVar54 ^ auVar7);
          if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 5] = uVar23 + 5;
          }
          auVar54 = auVar41 ^ auVar9;
          iVar72 = -(uint)((int)local_198._0_4_ < auVar54._0_4_);
          auVar76._4_4_ = -(uint)((int)local_198._4_4_ < auVar54._4_4_);
          iVar77 = -(uint)(iStack_190 < auVar54._8_4_);
          auVar76._12_4_ = -(uint)(iStack_18c < auVar54._12_4_);
          auVar62._4_4_ = iVar72;
          auVar62._0_4_ = iVar72;
          auVar62._8_4_ = iVar77;
          auVar62._12_4_ = iVar77;
          auVar71._4_4_ = -(uint)(auVar54._4_4_ == local_198._4_4_);
          auVar71._12_4_ = -(uint)(auVar54._12_4_ == iStack_18c);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar54 = auVar71 & auVar62 | auVar76;
          auVar54 = packssdw(auVar54,auVar54);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar54 ^ auVar8,auVar54 ^ auVar8);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 6] = uVar23 + 6;
          }
          auVar54 = pshufhw(auVar62,auVar62,0x84);
          auVar84 = pshufhw(auVar71,auVar71,0x84);
          auVar80 = pshufhw(auVar54,auVar76,0x84);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar80 | auVar84 & auVar54) ^ auVar63;
          auVar54 = packssdw(auVar63,auVar63);
          if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_a8[uVar24 + 7] = uVar23 + 7;
          }
          uVar24 = uVar24 + 8;
          lVar39 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 8;
          auVar44._8_8_ = lVar39 + 8;
          lVar39 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + 8;
          auVar43._8_8_ = lVar39 + 8;
          lVar39 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 8;
          auVar42._8_8_ = lVar39 + 8;
          lVar39 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar39 + 8;
        } while ((uVar34 + 7 & 0x1fffffff8) != uVar24);
      }
      if (local_1b8 != 0) {
        uVar34 = local_1b8 - 1;
        auVar25 = (undefined1  [8])0x0;
        uVar35 = 0;
        uVar24 = local_200;
        pLVar32 = local_1c0;
        uVar26 = uVar33;
        uVar29 = local_1b8;
        puVar40 = in;
LAB_0010d3bb:
        uVar37 = uVar33;
        if (uVar24 < uVar33) {
          uVar37 = uVar24;
        }
        inpos = uVar35 * uVar26;
        insize_00 = inpos + uVar26;
        if (uVar24 <= inpos + uVar26) {
          insize_00 = uVar24;
        }
        uVar14 = (uint)(uVar35 == uVar34);
        if (pLVar32->btype == 2) {
          local_210 = (uint *)CONCAT44(local_210._4_4_,uVar14);
          local_198 = auVar25;
          local_d8 = (undefined1  [16])0x0;
          local_c8 = 0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_cl.tree2d = (uint *)0x0;
          tree_cl.tree1d = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          local_158 = (undefined1  [16])0x0;
          local_148 = 0;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = 0;
          local_88 = (undefined1  [16])0x0;
          local_78 = 0;
          if (pLVar32->use_lz77 == 0) {
            local_1d8 = uVar33;
            local_1a8 = uVar35;
            uVar14 = uivector_resize((uivector *)local_d8,insize_00 - inpos);
            if (uVar14 == 0) {
              local_208 = (uint *)CONCAT44(local_208._4_4_,0x53);
              goto LAB_0010d9bc;
            }
            if (inpos < insize_00) {
              lVar39 = 0;
              do {
                *(uint *)(local_d8._0_8_ + lVar39 * 4) = (uint)puVar40[lVar39];
                lVar39 = lVar39 + 1;
              } while (uVar37 + (long)auVar25 != lVar39);
            }
LAB_0010d607:
            puVar36 = (uint *)calloc(1,0x478);
            local_208 = (uint *)CONCAT44(local_208._4_4_,0x53);
            if (puVar36 == (uint *)0x0) goto LAB_0010d9bc;
            puVar19 = (uint *)calloc(1,0x78);
            if (puVar19 == (uint *)0x0) goto LAB_0010d9bf;
            if (local_d8._8_8_ != 0) {
              sVar28 = 0;
              do {
                uVar14 = *(uint *)(local_d8._0_8_ + sVar28 * 4);
                puVar36[uVar14] = puVar36[uVar14] + 1;
                if (0x100 < (ulong)uVar14) {
                  puVar19[*(uint *)(local_d8._0_8_ + (sVar28 + 2) * 4)] =
                       puVar19[*(uint *)(local_d8._0_8_ + (sVar28 + 2) * 4)] + 1;
                  sVar28 = sVar28 + 3;
                }
                sVar28 = sVar28 + 1;
              } while (sVar28 != local_d8._8_8_);
            }
            puVar36[0x100] = 1;
            uVar14 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar36,0x101,0x11e,0xf);
            if ((uVar14 == 0) &&
               (uVar14 = HuffmanTree_makeFromFrequencies(&tree_d,puVar19,2,0x1e,0xf),
               uVar15 = tree_d.numcodes, puVar20 = tree_ll.lengths, uVar14 == 0)) {
              uVar33 = 0x11e;
              if (tree_ll.numcodes < 0x11e) {
                uVar33 = (ulong)tree_ll.numcodes;
              }
              local_b8 = 0x1e;
              if (tree_d.numcodes < 0x1e) {
                local_b8 = (ulong)tree_d.numcodes;
              }
              local_1d0 = puVar40;
              local_1c8 = puVar36;
              local_b0 = puVar19;
              if (tree_ll.numcodes != 0) {
                uVar24 = 0;
                do {
                  uVar14 = puVar20[uVar24];
                  uVar16 = uivector_resize((uivector *)local_158,local_158._8_8_ + 1);
                  if (uVar16 != 0) {
                    *(uint *)(local_158._0_8_ + (local_158._8_8_ - 1) * 4) = uVar14;
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar33 != uVar24);
              }
              uVar24 = local_b8;
              puVar36 = tree_d.lengths;
              local_70 = uVar33;
              if (uVar15 != 0) {
                uVar33 = 0;
                do {
                  uVar14 = puVar36[uVar33];
                  uVar15 = uivector_resize((uivector *)local_158,local_158._8_8_ + 1);
                  if (uVar15 != 0) {
                    *(uint *)(local_158._0_8_ + (local_158._8_8_ - 1) * 4) = uVar14;
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar24 != uVar33);
              }
              uVar33 = (ulong)(uint)local_158._8_4_;
              puVar40 = local_1d0;
              if (uVar33 != 0) {
                uVar12 = local_158._0_8_;
                uVar24 = 0;
                do {
                  uVar35 = uVar24 + 1;
                  uVar14 = *(uint *)(uVar12 + uVar24 * 4);
                  if (uVar35 < uVar33) {
                    uVar29 = 0;
                    uVar26 = uVar35;
                    do {
                      if (*(uint *)(uVar12 + uVar26 * 4) != uVar14) break;
                      uVar29 = (ulong)((int)uVar29 + 1);
                      uVar26 = uVar35 + uVar29;
                    } while (uVar26 < uVar33);
                    uVar15 = (uint)uVar29;
                    if (uVar15 < 2 || uVar14 != 0) {
                      puVar40 = local_1d0;
                      if (uVar15 < 3) goto LAB_0010dc7c;
                      uVar16 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                      if (uVar16 != 0) {
                        *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar14;
                      }
                      uVar35 = uVar29 / 6;
                      if (5 < uVar15) {
                        do {
                          uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                          if (uVar14 != 0) {
                            *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x10;
                          }
                          uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                          if (uVar14 != 0) {
                            *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 3;
                          }
                          uVar35 = uVar35 - 1;
                        } while (uVar35 != 0);
                      }
                      uVar14 = uVar15 + (int)(uVar29 / 6) * -6;
                      if (uVar14 < 3) {
                        uVar29 = (ulong)(uVar15 - uVar14);
                      }
                      else {
                        uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar15 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x10;
                        }
                        uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar15 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar14 - 3;
                        }
                      }
                    }
                    else {
                      uVar14 = uVar15 + 1;
                      if (uVar14 < 0xb) {
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x11;
                        }
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar15 - 2;
                        }
                      }
                      else {
                        if (0x89 < uVar14) {
                          uVar14 = 0x8a;
                        }
                        uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar15 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x12;
                        }
                        uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar15 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar14 - 0xb;
                        }
                        uVar29 = (ulong)(uVar14 - 1);
                      }
                    }
                    uVar24 = uVar24 + uVar29;
                    puVar40 = local_1d0;
                  }
                  else {
LAB_0010dc7c:
                    uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                    if (uVar15 != 0) {
                      *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar14;
                    }
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar33);
              }
              puVar20 = (uint *)calloc(1,0x4c);
              puVar19 = local_b0;
              pLVar32 = local_1c0;
              puVar36 = local_1c8;
              if (puVar20 == (uint *)0x0) {
                puVar20 = (uint *)0x0;
                uVar29 = local_1b8;
              }
              else {
                uVar12 = local_1f8._8_8_;
                if (local_1f8._8_8_ != 0) {
                  sVar28 = 0;
                  do {
                    uVar14 = *(uint *)(local_1f8._0_8_ + sVar28 * 4);
                    puVar20[uVar14] = puVar20[uVar14] + 1;
                    sVar28 = (sVar28 - ((ulong)uVar14 < 0x10)) + 2;
                  } while (sVar28 != local_1f8._8_8_);
                }
                uVar14 = HuffmanTree_makeFromFrequencies(&tree_cl,puVar20,0x13,0x13,7);
                if (uVar14 == 0) {
                  uVar24 = (ulong)tree_cl.numcodes;
                  uVar14 = uivector_resize((uivector *)local_88,uVar24);
                  uVar33 = local_70;
                  pLVar32 = local_1c0;
                  uVar29 = local_1b8;
                  if (uVar14 != 0) {
                    if (uVar24 != 0) {
                      lVar39 = 0;
                      do {
                        *(uint *)(local_88._0_8_ + lVar39) =
                             tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar39)];
                        lVar39 = lVar39 + 4;
                      } while (uVar24 << 2 != lVar39);
                    }
                    do {
                      auVar9 = local_88;
                      sVar28 = local_1e0;
                      uVar11 = local_88._0_8_;
                      if (((ulong)local_88._8_8_ < 5) ||
                         (*(uint *)(local_88._0_8_ + (local_88._8_8_ - 1) * 4) != 0)) {
                        iVar72 = (uint)local_210;
                        if ((local_1e0 & 7) == 0) {
                          puVar36 = (uint *)(local_228.size + 1);
                          uVar14 = ucvector_reserve(&local_228,(size_t)puVar36);
                          iVar72 = (uint)local_210;
                          if (uVar14 != 0) {
                            *(undefined1 *)((long)local_228.data + -1 + (long)puVar36) = 0;
                            local_228.size = (size_t)puVar36;
                          }
                        }
                        pbVar1 = (byte *)((long)local_228.data + -1 + local_228.size);
                        *pbVar1 = *pbVar1 | (byte)(iVar72 << ((byte)sVar28 & 7));
                        if (((int)sVar28 + 1U & 7) == 0) {
                          puVar36 = (uint *)(local_228.size + 1);
                          uVar14 = ucvector_reserve(&local_228,(size_t)puVar36);
                          if (uVar14 != 0) {
                            *(undefined1 *)((long)local_228.data + -1 + (long)puVar36) = 0;
                            local_228.size = (size_t)puVar36;
                          }
                        }
                        if ((sVar28 + 2 & 7) == 0) {
                          local_210 = (uint *)(local_228.size + 1);
                          uVar14 = ucvector_reserve(&local_228,(size_t)local_210);
                          if (uVar14 != 0) {
                            local_228.size = (size_t)local_210;
                            *(undefined1 *)((long)local_228.data + -1 + (long)local_210) = 0;
                          }
                        }
                        pbVar1 = (byte *)((long)local_228.data + -1 + local_228.size);
                        *pbVar1 = *pbVar1 | '\x01' << ((byte)(sVar28 + 2) & 7);
                        local_1e0 = sVar28 + 3;
                        iVar72 = auVar9._8_4_;
                        uVar35 = (ulong)(iVar72 - 4) + 3;
                        uVar24 = 0;
                        goto LAB_0010e05c;
                      }
                      uVar14 = uivector_resize((uivector *)local_88,local_88._8_8_ - 1);
                      uVar29 = local_1b8;
                      puVar36 = local_1c8;
                      puVar40 = local_1d0;
                    } while (uVar14 != 0);
                  }
                }
                else {
                  local_208 = (uint *)CONCAT44(local_208._4_4_,uVar14);
                  uVar29 = local_1b8;
                }
              }
            }
            else {
              puVar20 = (uint *)0x0;
              local_208 = (uint *)CONCAT44(local_208._4_4_,uVar14);
            }
          }
          else {
            local_1d8 = uVar33;
            local_1a8 = uVar35;
            uVar14 = encodeLZ77((uivector *)local_d8,&local_60,in,inpos,insize_00,
                                pLVar32->windowsize,pLVar32->minmatch,pLVar32->nicematch,
                                pLVar32->lazymatching);
            if (uVar14 == 0) goto LAB_0010d607;
            local_208 = (uint *)CONCAT44(local_208._4_4_,uVar14);
LAB_0010d9bc:
            puVar36 = (uint *)0x0;
LAB_0010d9bf:
            puVar19 = (uint *)0x0;
            puVar20 = (uint *)0x0;
          }
          goto LAB_0010d9c4;
        }
        uVar15 = 0;
        if (pLVar32->btype == 1) {
          local_210 = (uint *)CONCAT44(local_210._4_4_,uVar14);
          local_198 = auVar25;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          local_1d8 = uVar33;
          local_1d0 = puVar40;
          local_1a8 = uVar35;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          sVar28 = local_1e0;
          puVar19 = (uint *)local_228.size;
          puVar36 = (uint *)local_228.data;
          iVar72 = (uint)local_210;
          if ((local_1e0 & 7) == 0) {
            puVar20 = (uint *)(local_228.size + 1);
            if (local_228.allocsize < puVar20) {
              local_1c8 = (uint *)((ulong)((long)puVar20 * 3) >> 1);
              if ((uint *)(local_228.allocsize * 2) < puVar20) {
                local_1c8 = puVar20;
              }
              local_208 = puVar20;
              puVar22 = (uint *)realloc(local_228.data,(size_t)local_1c8);
              iVar72 = (uint)local_210;
              if (puVar22 == (uint *)0x0) goto LAB_0010d6f7;
              local_228.allocsize = (size_t)local_1c8;
              puVar20 = local_208;
              local_228.data = (uchar *)puVar22;
            }
            *(undefined1 *)((long)local_228.data + -1 + (long)puVar20) = 0;
            puVar36 = (uint *)local_228.data;
            puVar19 = puVar20;
            iVar72 = (uint)local_210;
            local_228.size = (size_t)puVar20;
          }
LAB_0010d6f7:
          sVar10 = local_228.size;
          pbVar1 = (byte *)((long)puVar36 + -1 + (long)puVar19);
          *pbVar1 = *pbVar1 | (byte)(iVar72 << ((byte)sVar28 & 7));
          puVar19 = (uint *)local_228.data;
          puVar36 = (uint *)sVar10;
          if ((sVar28 + 1 & 7) == 0) {
            puVar36 = (uint *)(local_228.size + 1);
            if (local_228.allocsize < puVar36) {
              local_1c8 = (uint *)((ulong)((long)puVar36 * 3) >> 1);
              if ((uint *)(local_228.allocsize * 2) < puVar36) {
                local_1c8 = puVar36;
              }
              local_210 = (uint *)local_228.data;
              local_208 = puVar36;
              puVar20 = (uint *)realloc(local_228.data,(size_t)local_1c8);
              puVar19 = local_210;
              puVar36 = (uint *)sVar10;
              if (puVar20 == (uint *)0x0) goto LAB_0010d77f;
              local_228.allocsize = (size_t)local_1c8;
              puVar36 = local_208;
              local_228.data = (uchar *)puVar20;
            }
            *(undefined1 *)(((long)local_228.data - 1U) + (long)puVar36) = 0;
            puVar19 = (uint *)local_228.data;
            local_228.size = (size_t)puVar36;
          }
LAB_0010d77f:
          pbVar1 = (byte *)(((long)puVar19 - 1U) + (long)puVar36);
          *pbVar1 = *pbVar1 | '\x01' << ((byte)(sVar28 + 1) & 7);
          if (((int)sVar28 + 2U & 7) == 0) {
            puVar20 = (uint *)(local_228.size + 1);
            puVar19 = (uint *)local_228.data;
            puVar36 = (uint *)local_228.allocsize;
            if (local_228.allocsize < puVar20) {
              puVar36 = (uint *)((ulong)((long)puVar20 * 3) >> 1);
              if ((uint *)(local_228.allocsize * 2) < puVar20) {
                puVar36 = puVar20;
              }
              puVar19 = (uint *)realloc(local_228.data,(size_t)puVar36);
              if (puVar19 == (uint *)0x0) goto LAB_0010d7e7;
            }
            local_228.allocsize = (size_t)puVar36;
            local_228.data = (uchar *)puVar19;
            *(undefined1 *)((long)local_228.data + -1 + (long)puVar20) = 0;
            local_228.size = (size_t)puVar20;
          }
LAB_0010d7e7:
          puVar36 = tree_ll.lengths;
          puVar40 = local_1d0;
          local_1e0 = sVar28 + 3;
          if (local_1c0->use_lz77 == 0) {
            puVar19 = tree_ll.tree1d;
            if (inpos < insize_00) {
              lVar39 = 0;
              do {
                addHuffmanSymbol(&local_1e0,&local_228,puVar19[puVar40[lVar39]],
                                 puVar36[puVar40[lVar39]]);
                lVar39 = lVar39 + 1;
              } while (uVar37 + (long)auVar25 != lVar39);
            }
LAB_0010d925:
            addHuffmanSymbol(&local_1e0,&local_228,puVar19[0x100],puVar36[0x100]);
            uVar15 = 0;
          }
          else {
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            uVar15 = encodeLZ77((uivector *)&tree_cl,&local_60,in,inpos,insize_00,
                                local_1c0->windowsize,local_1c0->minmatch,local_1c0->nicematch,
                                local_1c0->lazymatching);
            puVar40 = local_1d0;
            if (uVar15 == 0) {
              writeLZ77data(&local_1e0,&local_228,(uivector *)&tree_cl,&tree_ll,&tree_d);
              free(tree_cl.tree2d);
              puVar19 = tree_ll.tree1d;
              puVar36 = tree_ll.lengths;
              goto LAB_0010d925;
            }
            free(tree_cl.tree2d);
            puVar19 = tree_ll.tree1d;
            puVar36 = tree_ll.lengths;
          }
          free(tree_ll.tree2d);
          free(puVar19);
          free(puVar36);
          free(tree_d.tree2d);
          free(tree_d.tree1d);
          free(tree_d.lengths);
          auVar25 = local_198;
          uVar24 = local_200;
          pLVar32 = local_1c0;
          uVar33 = local_1d8;
          uVar35 = local_1a8;
          uVar26 = local_1b0;
          uVar29 = local_1b8;
        }
        goto LAB_0010daa6;
      }
      uVar15 = 0;
LAB_0010e210:
      free(local_68);
      free(local_a0);
      free(local_90);
      free(local_98);
      free(__s_00);
      free(local_a8);
      outsize = local_1a0;
    }
  }
LAB_0010e273:
  *out = local_228.data;
  *outsize = local_228.size;
  return uVar15;
  while (uVar29 = uVar35 & 0xffffffff, uVar35 = uVar35 - 1, uVar24 = uVar26 + 1,
        *(uint *)(uVar11 + uVar29 * 4) == 0) {
LAB_0010e05c:
    uVar26 = uVar24;
    if (uVar26 == iVar72 - 4) break;
  }
  iVar77 = (int)(uVar26 + 1);
  local_210 = (uint *)CONCAT44(local_210._4_4_,(iVar72 - iVar77) + -3);
  iVar38 = (int)local_b8;
  local_208 = (uint *)CONCAT44(local_208._4_4_,iVar72 + 1);
  addBitsToStream(&local_1e0,&local_228,(int)uVar33 - 0x101,5);
  addBitsToStream(&local_1e0,&local_228,iVar38 - 1,5);
  addBitsToStream(&local_1e0,&local_228,(uint)local_210,4);
  if ((uint)local_208 != iVar77) {
    uVar33 = 0;
    do {
      addBitsToStream(&local_1e0,&local_228,*(uint *)(uVar11 + uVar33 * 4),3);
      uVar33 = uVar33 + 1;
    } while ((uint)(iVar72 - (int)uVar26) != uVar33);
  }
  if (uVar12 != 0) {
    uVar11 = local_1f8._0_8_;
    puVar36 = tree_cl.tree1d;
    local_210 = tree_cl.lengths;
    sVar28 = 0;
    do {
      addHuffmanSymbol(&local_1e0,&local_228,puVar36[*(uint *)(uVar11 + sVar28 * 4)],
                       local_210[*(uint *)(uVar11 + sVar28 * 4)]);
      puVar19 = (uint *)(uVar11 + sVar28 * 4);
      if (*puVar19 - 0x10 < 3) {
        lVar39 = sVar28 + 1;
        sVar28 = sVar28 + 1;
        addBitsToStream(&local_1e0,&local_228,*(uint *)(uVar11 + lVar39 * 4),
                        *(size_t *)(&DAT_00123040 + (ulong)(*puVar19 - 0x10) * 8));
      }
      sVar28 = sVar28 + 1;
    } while (sVar28 != uVar12);
  }
  writeLZ77data(&local_1e0,&local_228,(uivector *)local_d8,&tree_ll,&tree_d);
  puVar19 = local_b0;
  if (tree_ll.lengths[0x100] == 0) {
    local_208 = (uint *)CONCAT44(local_208._4_4_,0x40);
    pLVar32 = local_1c0;
    uVar29 = local_1b8;
    puVar36 = local_1c8;
    puVar40 = local_1d0;
  }
  else {
    addHuffmanSymbol(&local_1e0,&local_228,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
    local_208 = (uint *)((ulong)local_208 & 0xffffffff00000000);
    pLVar32 = local_1c0;
    uVar29 = local_1b8;
    puVar36 = local_1c8;
    puVar40 = local_1d0;
  }
LAB_0010d9c4:
  free((void *)local_d8._0_8_);
  free(tree_ll.tree2d);
  free(tree_ll.tree1d);
  free(tree_ll.lengths);
  free(tree_d.tree2d);
  free(tree_d.tree1d);
  free(tree_d.lengths);
  free(tree_cl.tree2d);
  free(tree_cl.tree1d);
  free(tree_cl.lengths);
  free(puVar36);
  free(puVar19);
  free(puVar20);
  free((void *)local_1f8._0_8_);
  free((void *)local_158._0_8_);
  free((void *)local_88._0_8_);
  auVar25 = local_198;
  uVar24 = local_200;
  uVar33 = local_1d8;
  uVar35 = local_1a8;
  uVar26 = local_1b0;
  uVar15 = (uint)local_208;
LAB_0010daa6:
  uVar35 = uVar35 + 1;
  if (uVar35 == uVar29) goto LAB_0010e210;
  uVar33 = uVar33 + uVar26;
  auVar25 = (undefined1  [8])((long)auVar25 - uVar26);
  puVar40 = puVar40 + uVar26;
  if (uVar15 != 0) goto LAB_0010e210;
  goto LAB_0010d3bb;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
	const unsigned char* in, size_t insize,
	const LodePNGCompressSettings* settings)
{
	unsigned error;
	ucvector v;
	ucvector_init_buffer(&v, *out, *outsize);
	error = lodepng_deflatev(&v, in, insize, settings);
	*out = v.data;
	*outsize = v.size;
	return error;
}